

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

void google::protobuf::internal::WireFormat::SerializeUnknownFields
               (UnknownFieldSet *unknown_fields,CodedOutputStream *output)

{
  uint uVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  pointer pUVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar7 = 0;
  lVar6 = 0;
  while( true ) {
    pvVar2 = unknown_fields->fields_;
    if (pvVar2 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = (long)(int)((ulong)((long)(pvVar2->
                                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar2->
                                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    if (lVar5 <= lVar6) break;
    pUVar3 = (pvVar2->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar1 = *(uint *)(&pUVar3->field_0x0 + lVar7);
    switch(uVar1 >> 0x1d) {
    case 0:
      io::CodedOutputStream::WriteVarint32(output,uVar1 << 3);
      if (0x1fffffff < *(uint *)(&pUVar3->field_0x0 + lVar7)) {
        __assert_fail("type_ == TYPE_VARINT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/unknown_field_set.h"
                      ,0x102,"uint64 google::protobuf::UnknownField::varint() const");
      }
      io::CodedOutputStream::WriteVarint64(output,*(uint64 *)((long)&pUVar3->field_2 + lVar7));
      break;
    case 1:
      io::CodedOutputStream::WriteVarint32(output,uVar1 * 8 + 5);
      if ((*(uint *)(&pUVar3->field_0x0 + lVar7) & 0xe0000000) != 0x20000000) {
        __assert_fail("type_ == TYPE_FIXED32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/unknown_field_set.h"
                      ,0x106,"uint32 google::protobuf::UnknownField::fixed32() const");
      }
      io::CodedOutputStream::WriteLittleEndian32(output,*(uint32 *)((long)&pUVar3->field_2 + lVar7))
      ;
      break;
    case 2:
      io::CodedOutputStream::WriteVarint32(output,uVar1 * 8 + 1);
      if ((*(uint *)(&pUVar3->field_0x0 + lVar7) & 0xe0000000) != 0x40000000) {
        __assert_fail("type_ == TYPE_FIXED64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/unknown_field_set.h"
                      ,0x10a,"uint64 google::protobuf::UnknownField::fixed64() const");
      }
      io::CodedOutputStream::WriteLittleEndian64(output,*(uint64 *)((long)&pUVar3->field_2 + lVar7))
      ;
      break;
    case 3:
      io::CodedOutputStream::WriteVarint32(output,uVar1 * 8 + 2);
      if (((*(uint *)(&pUVar3->field_0x0 + lVar7) & 0xe0000000) != 0x60000000) ||
         (io::CodedOutputStream::WriteVarint32
                    (output,*(uint32 *)(*(long *)((long)&pUVar3->field_2 + lVar7) + 8)),
         (*(uint *)(&pUVar3->field_0x0 + lVar7) & 0xe0000000) != 0x60000000)) {
        __assert_fail("type_ == TYPE_LENGTH_DELIMITED",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/unknown_field_set.h"
                      ,0x10e,
                      "const string &google::protobuf::UnknownField::length_delimited() const");
      }
      puVar4 = *(undefined8 **)((long)&pUVar3->field_2 + lVar7);
      io::CodedOutputStream::WriteRaw(output,(void *)*puVar4,*(int *)(puVar4 + 1));
      break;
    case 4:
      io::CodedOutputStream::WriteVarint32(output,uVar1 * 8 + 3);
      __assert_fail("type_ == TYPE_GROUP",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/unknown_field_set.h"
                    ,0x112,"const UnknownFieldSet &google::protobuf::UnknownField::group() const");
    }
    lVar6 = lVar6 + 1;
    lVar7 = lVar7 + 0x10;
  }
  return;
}

Assistant:

void WireFormat::SerializeUnknownFields(const UnknownFieldSet& unknown_fields,
                                        io::CodedOutputStream* output) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);
    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_VARINT));
        output->WriteVarint64(field.varint());
        break;
      case UnknownField::TYPE_FIXED32:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_FIXED32));
        output->WriteLittleEndian32(field.fixed32());
        break;
      case UnknownField::TYPE_FIXED64:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_FIXED64));
        output->WriteLittleEndian64(field.fixed64());
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
        output->WriteVarint32(field.length_delimited().size());
        output->WriteString(field.length_delimited());
        break;
      case UnknownField::TYPE_GROUP:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_START_GROUP));
        SerializeUnknownFields(field.group(), output);
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_END_GROUP));
        break;
    }
  }
}